

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O0

int read_partial_array(coda_cursor_conflict *cursor,long offset,long length,void *dst)

{
  int iVar1;
  coda_backend cVar2;
  int iVar3;
  coda_dynamic_type_struct *pcVar4;
  int iVar5;
  size_t sStack_70;
  coda_endianness system_endianness;
  int64_t local_size;
  int64_t local_offset;
  long lStack_58;
  int i;
  int64_t target_offset;
  int record_to_id;
  int record_from_id;
  long record_size;
  coda_type_class type_class;
  coda_cdf_variable *variable;
  void *dst_local;
  long length_local;
  long offset_local;
  coda_cursor_conflict *cursor_local;
  
  pcVar4 = cursor->stack[cursor->n + -1].type;
  iVar1 = *(int *)((long)&pcVar4[2].definition + 4);
  cVar2 = pcVar4[3].backend;
  if (pcVar4[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0x128,"int read_partial_array(const coda_cursor *, long, long, void *)");
  }
  if (*(long *)(pcVar4 + 2) == 0) {
    record_size._4_4_ = pcVar4->definition->type_class;
  }
  else {
    record_size._4_4_ = *(coda_type_class *)(*(long *)(*(long *)(pcVar4 + 2) + 8) + 8);
  }
  local_offset._4_4_ = (int)(offset / (long)*(int *)((long)&pcVar4[2].definition + 4));
  iVar3 = *(int *)((long)&pcVar4[2].definition + 4);
  lStack_58 = 0;
  while( true ) {
    if ((int)((offset + length) / (long)iVar3) < local_offset._4_4_) {
      if ((record_size._4_4_ != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
        switch(pcVar4[3].backend) {
        case coda_backend_binary:
          break;
        case 2:
          for (local_offset._4_4_ = 0; local_offset._4_4_ < length;
              local_offset._4_4_ = local_offset._4_4_ + 1) {
            swap2((void *)((long)dst + (long)local_offset._4_4_ * 2));
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                        ,0x17b,"int read_partial_array(const coda_cursor *, long, long, void *)");
        case 4:
          for (local_offset._4_4_ = 0; local_offset._4_4_ < length;
              local_offset._4_4_ = local_offset._4_4_ + 1) {
            swap4((void *)((long)dst + (long)local_offset._4_4_ * 4));
          }
          break;
        case 8:
          for (local_offset._4_4_ = 0; local_offset._4_4_ < length;
              local_offset._4_4_ = local_offset._4_4_ + 1) {
            swap8((void *)((long)dst + (long)local_offset._4_4_ * 8));
          }
        }
      }
      return 0;
    }
    local_size = 0;
    if (*(long *)(*(long *)(pcVar4 + 4) + (long)local_offset._4_4_ * 8) < 0) break;
    sStack_70 = (long)(int)(iVar1 * cVar2);
    if (offset + length <
        (long)((local_offset._4_4_ + 1) * *(int *)((long)&pcVar4[2].definition + 4))) {
      sStack_70 = ((offset + length) -
                  (long)(local_offset._4_4_ * *(int *)((long)&pcVar4[2].definition + 4))) *
                  (long)(int)pcVar4[3].backend;
    }
    if (local_offset._4_4_ * *(int *)((long)&pcVar4[2].definition + 4) < offset) {
      local_size = (offset - local_offset._4_4_ * *(int *)((long)&pcVar4[2].definition + 4)) *
                   (long)(int)pcVar4[3].backend;
      sStack_70 = sStack_70 - local_size;
    }
    if (pcVar4[4].definition == (coda_type *)0x0) {
      iVar5 = read_bytes((coda_product *)cursor->product[1].filename,
                         *(long *)(*(long *)(pcVar4 + 4) + (long)local_offset._4_4_ * 8) +
                         local_size,sStack_70,(void *)((long)dst + lStack_58));
      if (iVar5 != 0) {
        return -1;
      }
    }
    else {
      memcpy((void *)((long)dst + lStack_58),
             (void *)((long)&(pcVar4[4].definition)->format +
                     *(long *)(*(long *)(pcVar4 + 4) + (long)local_offset._4_4_ * 8) + local_size),
             sStack_70);
    }
    lStack_58 = sStack_70 + lStack_58;
    local_offset._4_4_ = local_offset._4_4_ + 1;
  }
  coda_set_error(-200,"Missing record not supported for CDF variable");
  return -1;
}

Assistant:

static int read_partial_array(const coda_cursor *cursor, long offset, long length, void *dst)
{
    coda_netcdf_array *type;
    coda_netcdf_product *product;
    long value_size;
    long i;

    type = (coda_netcdf_array *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;

    value_size = (long)(type->base_type->definition->bit_size >> 3);
    if (type->base_type->record_var)
    {
        long num_blocks = type->definition->dim[0];
        long num_values_per_block;
        int64_t target_offset;

        num_values_per_block = type->definition->num_elements / num_blocks;
        target_offset = 0;

        for (i = 0; i < num_blocks; i++)
        {
            int64_t local_offset = 0;   /* byte offset within record */
            int64_t local_size = num_values_per_block * value_size;     /* amount of bytes to read */

            if (offset + length < (i + 1) * num_values_per_block)
            {
                local_size = (offset + length - i * num_values_per_block) * value_size;
            }
            if (offset > i * num_values_per_block)
            {
                local_offset = (offset - i * num_values_per_block) * value_size;
                local_size -= local_offset;
            }
            if (read_bytes(product->raw_product, type->base_type->offset + i * product->record_size + local_offset,
                           local_size, &((uint8_t *)dst)[target_offset]) != 0)
            {
                return -1;
            }
            target_offset += local_size;
        }

    }
    else
    {
        if (read_bytes(product->raw_product, type->base_type->offset + offset * value_size, length * value_size,
                       (uint8_t *)dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    switch (type->base_type->definition->bit_size)
    {
        case 8:
            /* no endianness conversion needed */
            break;
        case 16:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap2(&((int16_t *)dst)[i]);
            }
            break;
        case 32:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap4(&((int32_t *)dst)[i]);
            }
            break;
        case 64:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap8(&((int64_t *)dst)[i]);
            }
            break;
        default:
            assert(0);
            exit(1);
    }
#endif

    return 0;
}